

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::Int64FeatureType::MergePartialFromCodedStream
          (Int64FeatureType *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  bool bVar4;
  uint32 tag;
  uint32 first_byte_or_zero;
  
  do {
    pbVar2 = input->buffer_;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      tag = (uint32)bVar1;
      first_byte_or_zero = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_00132251;
      input->buffer_ = pbVar2 + 1;
    }
    else {
      first_byte_or_zero = 0;
LAB_00132251:
      tag = google::protobuf::io::CodedInputStream::ReadTagFallback(input,first_byte_or_zero);
    }
    bVar3 = (tag & 7) == 4 || tag == 0;
    if (bVar3) {
      return bVar3;
    }
    bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,tag);
    if (!bVar4) {
      return bVar3;
    }
  } while( true );
}

Assistant:

bool Int64FeatureType::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.Int64FeatureType)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
  handle_unusual:
    if (tag == 0 ||
        ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
        ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
      goto success;
    }
    DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.Int64FeatureType)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.Int64FeatureType)
  return false;
#undef DO_
}